

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

size_type __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Hash,phmap::EqualTo<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>>>
::
erase<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>
          (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Hash,phmap::EqualTo<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>>>
           *this,key_arg<Int> *key)

{
  raw_hash_set<phmap::priv::NodeHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
  *this_00;
  ctrl_t *pcVar1;
  size_type sVar2;
  uint uVar3;
  int iVar4;
  ushort uVar5;
  ushort uVar6;
  char cVar7;
  ctrl_t h;
  size_type extraout_RAX;
  long lVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  Int *key_1;
  size_t sVar12;
  ulong uVar13;
  bool bVar14;
  __m128i match;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  __m128i match_1;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  probe_seq<16UL> local_48;
  char cVar19;
  char cVar21;
  char cVar22;
  char cVar23;
  
  uVar13 = key->value;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar13;
  sVar12 = SUB168(auVar15 * ZEXT816(0xde5fb9d2630458e9),8) +
           SUB168(auVar15 * ZEXT816(0xde5fb9d2630458e9),0);
  lVar8 = (ulong)(((uint)(sVar12 >> 0x18) & 0xff ^
                  (uint)(sVar12 >> 8) & 0xffffff ^ (uint)(sVar12 >> 0x10) & 0xffff) & 0xf) * 0x30;
  this_00 = (raw_hash_set<phmap::priv::NodeHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
             *)(this + lVar8);
  raw_hash_set<phmap::priv::NodeHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
  ::probe(&local_48,this_00,sVar12);
  sVar2 = *(size_type *)(this + lVar8 + 8);
  auVar15 = ZEXT216(CONCAT11((char)sVar12,(char)sVar12) & 0x7f7f);
  auVar15 = pshuflw(auVar15,auVar15,0);
  do {
    pcVar9 = (char *)(*(long *)(this + lVar8) + local_48.offset_);
    cVar7 = pcVar9[0xf];
    cVar19 = auVar15[0];
    auVar20[0] = -(cVar19 == *pcVar9);
    cVar21 = auVar15[1];
    auVar20[1] = -(cVar21 == pcVar9[1]);
    cVar22 = auVar15[2];
    auVar20[2] = -(cVar22 == pcVar9[2]);
    cVar23 = auVar15[3];
    auVar20[3] = -(cVar23 == pcVar9[3]);
    auVar20[4] = -(cVar19 == pcVar9[4]);
    auVar20[5] = -(cVar21 == pcVar9[5]);
    auVar20[6] = -(cVar22 == pcVar9[6]);
    auVar20[7] = -(cVar23 == pcVar9[7]);
    auVar20[8] = -(cVar19 == pcVar9[8]);
    auVar20[9] = -(cVar21 == pcVar9[9]);
    auVar20[10] = -(cVar22 == pcVar9[10]);
    auVar20[0xb] = -(cVar23 == pcVar9[0xb]);
    auVar20[0xc] = -(cVar19 == pcVar9[0xc]);
    auVar20[0xd] = -(cVar21 == pcVar9[0xd]);
    auVar20[0xe] = -(cVar22 == pcVar9[0xe]);
    auVar20[0xf] = -(cVar23 == cVar7);
    for (uVar10 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                                (ushort)(auVar20[0xf] >> 7) << 0xf); uVar10 != 0;
        uVar10 = uVar10 - 1 & uVar10) {
      uVar3 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      uVar11 = uVar3 + local_48.offset_ & local_48.mask_;
      if (**(ulong **)(sVar2 + uVar11 * 8) == uVar13) {
        if (uVar11 == this_00->capacity_) {
          return sVar2;
        }
        pcVar9 = (char *)(*(long *)(this + lVar8) + uVar11);
        hash_policy_traits<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>,void>
        ::
        destroy<std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>>>
                  ((allocator<std::pair<const_Int,_Int>_> *)(sVar2 + uVar11 * 8),
                   (slot_type *)local_48.index_);
        if (-1 < *pcVar9) {
          this_00->size_ = this_00->size_ - 1;
          sVar12 = (long)pcVar9 - (long)this_00->ctrl_;
          pcVar1 = this_00->ctrl_ + (sVar12 - 0x10 & this_00->capacity_);
          auVar16[0] = -(*pcVar1 == -0x80);
          auVar16[1] = -(pcVar1[1] == -0x80);
          auVar16[2] = -(pcVar1[2] == -0x80);
          auVar16[3] = -(pcVar1[3] == -0x80);
          auVar16[4] = -(pcVar1[4] == -0x80);
          auVar16[5] = -(pcVar1[5] == -0x80);
          auVar16[6] = -(pcVar1[6] == -0x80);
          auVar16[7] = -(pcVar1[7] == -0x80);
          auVar16[8] = -(pcVar1[8] == -0x80);
          auVar16[9] = -(pcVar1[9] == -0x80);
          auVar16[10] = -(pcVar1[10] == -0x80);
          auVar16[0xb] = -(pcVar1[0xb] == -0x80);
          auVar16[0xc] = -(pcVar1[0xc] == -0x80);
          auVar16[0xd] = -(pcVar1[0xd] == -0x80);
          auVar16[0xe] = -(pcVar1[0xe] == -0x80);
          auVar16[0xf] = -(pcVar1[0xf] == -0x80);
          uVar5 = (ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar16[0xf] >> 7) << 0xf;
          uVar13 = 0;
          h = -2;
          if (uVar5 != 0) {
            auVar17[0] = -(*pcVar9 == -0x80);
            auVar17[1] = -(pcVar9[1] == -0x80);
            auVar17[2] = -(pcVar9[2] == -0x80);
            auVar17[3] = -(pcVar9[3] == -0x80);
            auVar17[4] = -(pcVar9[4] == -0x80);
            auVar17[5] = -(pcVar9[5] == -0x80);
            auVar17[6] = -(pcVar9[6] == -0x80);
            auVar17[7] = -(pcVar9[7] == -0x80);
            auVar17[8] = -(pcVar9[8] == -0x80);
            auVar17[9] = -(pcVar9[9] == -0x80);
            auVar17[10] = -(pcVar9[10] == -0x80);
            auVar17[0xb] = -(pcVar9[0xb] == -0x80);
            auVar17[0xc] = -(pcVar9[0xc] == -0x80);
            auVar17[0xd] = -(pcVar9[0xd] == -0x80);
            auVar17[0xe] = -(pcVar9[0xe] == -0x80);
            auVar17[0xf] = -(pcVar9[0xf] == -0x80);
            uVar6 = (ushort)(SUB161(auVar17 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar17[0xf] >> 7) << 0xf;
            if (uVar6 != 0) {
              iVar4 = 0;
              if (uVar6 != 0) {
                for (; (uVar6 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
                }
              }
              uVar10 = 0x1f;
              if (uVar5 != 0) {
                for (; ((uint)uVar5 << 0x10) >> uVar10 == 0; uVar10 = uVar10 - 1) {
                }
              }
              bVar14 = (uVar10 ^ 0x1f) + iVar4 < 0x10;
              uVar13 = (ulong)bVar14;
              h = -2;
              if (bVar14) {
                h = -0x80;
              }
            }
          }
          raw_hash_set<phmap::priv::NodeHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
          ::set_ctrl(this_00,sVar12,h);
          (this_00->settings_).
          super__Tuple_impl<0UL,_unsigned_long,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
          .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
               (this_00->settings_).
               super__Tuple_impl<0UL,_unsigned_long,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
               .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + uVar13;
          return extraout_RAX;
        }
        __assert_fail("IsFull(*it.inner_.ctrl_) && \"erasing a dangling iterator\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                      ,0x7c8,
                      "void phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<Int, Int>, Hash, phmap::EqualTo<Int>, std::allocator<std::pair<const Int, Int>>>::erase_meta_only(const_iterator) [Policy = phmap::priv::NodeHashMapPolicy<Int, Int>, Hash = Hash, Eq = phmap::EqualTo<Int>, Alloc = std::allocator<std::pair<const Int, Int>>]"
                     );
      }
    }
    auVar18[0] = -(*pcVar9 == -0x80);
    auVar18[1] = -(pcVar9[1] == -0x80);
    auVar18[2] = -(pcVar9[2] == -0x80);
    auVar18[3] = -(pcVar9[3] == -0x80);
    auVar18[4] = -(pcVar9[4] == -0x80);
    auVar18[5] = -(pcVar9[5] == -0x80);
    auVar18[6] = -(pcVar9[6] == -0x80);
    auVar18[7] = -(pcVar9[7] == -0x80);
    auVar18[8] = -(pcVar9[8] == -0x80);
    auVar18[9] = -(pcVar9[9] == -0x80);
    auVar18[10] = -(pcVar9[10] == -0x80);
    auVar18[0xb] = -(pcVar9[0xb] == -0x80);
    auVar18[0xc] = -(pcVar9[0xc] == -0x80);
    auVar18[0xd] = -(pcVar9[0xd] == -0x80);
    auVar18[0xe] = -(pcVar9[0xe] == -0x80);
    auVar18[0xf] = -(cVar7 == -0x80);
    if ((((((((((((((((auVar18 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar18 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar18 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar18 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar18 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar18 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar18 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar18 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar18 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar18 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar18 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar18 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar18 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar18 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar18 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar7 == -0x80) {
      return sVar2;
    }
    local_48.offset_ = local_48.index_ + local_48.offset_ + 0x10;
    local_48.index_ = local_48.index_ + 0x10;
    local_48.offset_ = local_48.offset_ & local_48.mask_;
  } while( true );
}

Assistant:

size_type erase(const key_arg<K>& key) {
        auto always_erase =  [](const value_type&){ return true; };
        return erase_if_impl<K, decltype(always_erase), ReadWriteLock>(key, std::move(always_erase));
    }